

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void copy_slot(lua_State *L,TValue *f,int idx)

{
  ulong uVar1;
  TValue *g;
  int in_EDX;
  anon_struct_8_2_f9ee98fb_for_u32 *in_RSI;
  lua_State *in_RDI;
  TValue *o;
  GCfunc *fn;
  TValue *o_1;
  undefined4 in_stack_ffffffffffffff88;
  ErrMsg in_stack_ffffffffffffff8c;
  global_State *in_stack_ffffffffffffff90;
  
  if (in_EDX == -0x2712) {
    (in_RDI->env).gcptr32 = in_RSI->lo;
  }
  else if (in_EDX == -0x2711) {
    uVar1 = (ulong)in_RDI->base[-1].u32.lo;
    if (*(char *)(uVar1 + 5) != '\b') {
      lj_err_msg((lua_State *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    *(uint32_t *)(uVar1 + 8) = in_RSI->lo;
    if (((0xfffffff6 < in_RSI->hi + 4) && ((*(byte *)((ulong)in_RSI->lo + 4) & 3) != 0)) &&
       ((*(byte *)(uVar1 + 4) & 4) != 0)) {
      lj_gc_barrierf(in_stack_ffffffffffffff90,
                     (GCobj *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (GCobj *)0x10aac0);
    }
  }
  else {
    g = index2adr(in_RDI,in_EDX);
    g->u32 = *in_RSI;
    if ((((in_EDX < -0x2712) && (0xfffffff6 < in_RSI->hi + 4)) &&
        ((*(byte *)((ulong)in_RSI->lo + 4) & 3) != 0)) &&
       ((*(byte *)((ulong)in_RDI->base[-1].u32.lo + 4) & 4) != 0)) {
      lj_gc_barrierf((global_State *)&g->field_2,
                     (GCobj *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (GCobj *)0x10abad);
    }
  }
  return;
}

Assistant:

static void copy_slot(lua_State *L, TValue *f, int idx)
{
  if (idx == LUA_GLOBALSINDEX) {
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(f)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    setgcref(fn->c.env, obj2gco(tabV(f)));
    lj_gc_barrier(L, fn, f);
  } else {
    TValue *o = index2adr_check(L, idx);
    copyTV(L, o, f);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), f);
  }
}